

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool __thiscall common::Config::GetHost(Config *this,string *group,int index,Host *host)

{
  __type _Var1;
  size_type sVar2;
  __shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  ulong local_40;
  size_t i;
  int num;
  Host *host_local;
  int index_local;
  string *group_local;
  Config *this_local;
  
  i._4_4_ = 0;
  local_40 = 0;
  do {
    sVar2 = std::
            vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>::
            size(&this->m_hosts);
    if (sVar2 <= local_40) {
      return false;
    }
    p_Var3 = (__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
             ::operator[](&this->m_hosts,local_40);
    peVar4 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var3);
    _Var1 = std::operator==(&peVar4->group,group);
    if (_Var1) {
      if (i._4_4_ == index) {
        p_Var3 = (__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::
                 vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                 ::operator[](&this->m_hosts,local_40);
        peVar4 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*(p_Var3);
        Host::operator=(host,peVar4);
        return true;
      }
      i._4_4_ = i._4_4_ + 1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool Config::GetHost(const std::string& group, int index, Host* host) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            if (num == index) {
                *host = *m_hosts[i];
                return true;
            }
            num++;
        }
    }
    return false;
}